

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_priority_queue.h
# Opt level: O0

key_type __thiscall
bk_lib::indexed_priority_queue<Clasp::SatElite::LessOccCost>::smaller_child
          (indexed_priority_queue<Clasp::SatElite::LessOccCost> *this,size_type n)

{
  bool bVar1;
  size_type sVar2;
  key_type kVar3;
  pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  LessOccCost *this_01;
  size_t in_RSI;
  long in_RDI;
  
  kVar3 = detail::heap_right(in_RSI);
  sVar2 = pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10));
  if (kVar3 < sVar2) {
    this_01 = (LessOccCost *)(in_RDI + 0x20);
    kVar3 = detail::heap_right(in_RSI);
    pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10),
               (size_type)kVar3);
    this_00 = (pod_vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10);
    kVar3 = detail::heap_left(in_RSI);
    pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,(size_type)kVar3);
    bVar1 = Clasp::SatElite::LessOccCost::operator()
                      (this_01,(Var)((ulong)this_00 >> 0x20),(Var)this_00);
    if (bVar1) {
      kVar3 = detail::heap_right(in_RSI);
      return kVar3;
    }
  }
  kVar3 = detail::heap_left(in_RSI);
  return kVar3;
}

Assistant:

key_type smaller_child(size_type n) const {
		using namespace detail;
		return heap_right(n) < (key_type)heap_.size() && compare_(heap_[heap_right(n)], heap_[heap_left(n)])
			? heap_right(n)
			: heap_left(n);
	}